

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

void __thiscall
capnp::compiler::ModuleLoader::ModuleLoader(ModuleLoader *this,GlobalErrorReporter *errorReporter)

{
  Impl *pIVar1;
  
  pIVar1 = (Impl *)operator_new(0x68);
  pIVar1->errorReporter = errorReporter;
  (pIVar1->searchPath).builder.ptr = (ReadableDirectory **)0x0;
  (pIVar1->searchPath).builder.pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
  (pIVar1->searchPath).builder.endPtr = (ReadableDirectory **)0x0;
  (pIVar1->searchPath).builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pIVar1->modules)._M_h._M_buckets = &(pIVar1->modules)._M_h._M_single_bucket;
  (pIVar1->modules)._M_h._M_bucket_count = 1;
  (pIVar1->modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->modules)._M_h._M_element_count = 0;
  (pIVar1->modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar1->fileIdsRequired = true;
  (this->impl).disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::compiler::ModuleLoader::Impl>::instance;
  (this->impl).ptr = pIVar1;
  return;
}

Assistant:

ModuleLoader::ModuleLoader(GlobalErrorReporter& errorReporter)
    : impl(kj::heap<Impl>(errorReporter)) {}